

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

CappedArray<char,_5UL> __thiscall kj::_::Stringifier::operator*(Stringifier *this,uchar i)

{
  char *pcVar1;
  char *pcVar2;
  uint8_t *puVar3;
  uint uVar4;
  uint8_t *puVar5;
  ulong uVar6;
  undefined7 in_register_00000031;
  bool bVar7;
  CappedArray<char,_5UL> CVar8;
  uint8_t reverse [4];
  CappedArray<char,_5UL> result;
  
  reverse[0] = '\0';
  reverse[1] = '\0';
  reverse[2] = '\0';
  reverse[3] = '\0';
  if ((int)CONCAT71(in_register_00000031,i) == 0) {
    puVar3 = reverse + 1;
    reverse[0] = '\0';
    reverse[1] = '\0';
    reverse[2] = '\0';
    reverse[3] = '\0';
  }
  else {
    puVar3 = reverse;
    uVar6 = (ulong)i;
    do {
      uVar4 = (uint)uVar6;
      *puVar3 = (char)uVar6 + (char)(uVar6 / 10) * -10;
      puVar3 = puVar3 + 1;
      uVar6 = uVar6 / 10;
    } while (9 < uVar4);
    pcVar2 = result.content;
    if (puVar3 <= reverse) {
      uVar6 = 0;
      goto LAB_0016e3e2;
    }
  }
  puVar5 = puVar3 + 0xb;
  pcVar1 = result.content;
  do {
    puVar3 = puVar3 + -1;
    *pcVar1 = *puVar3 + '0';
    pcVar2 = pcVar1 + 1;
    bVar7 = (uint8_t *)pcVar1 != puVar5;
    pcVar1 = pcVar2;
  } while (bVar7);
  uVar6 = result._8_8_ & 0xffffffffff;
LAB_0016e3e2:
  CVar8.currentSize = (long)pcVar2 - (long)result.content;
  CVar8.content[0] = (char)uVar6;
  CVar8.content[1] = (char)(uVar6 >> 8);
  CVar8.content[2] = (char)(uVar6 >> 0x10);
  CVar8.content[3] = (char)(uVar6 >> 0x18);
  CVar8.content[4] = (char)(uVar6 >> 0x20);
  CVar8._13_3_ = (int3)(uVar6 >> 0x28);
  return CVar8;
}

Assistant:

inline size_t size() const { return currentSize; }